

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  byte bVar1;
  global_State *pgVar2;
  uint uVar3;
  TValue *pTVar4;
  StkId pTVar5;
  GCObject *pGVar6;
  CallInfo *pCVar7;
  ulong uVar8;
  uint uVar9;
  CallInfo *pCVar10;
  int *piVar11;
  StkId pTVar12;
  int iVar13;
  long lVar14;
  bool bVar15;
  
  if (func->tt == 6) {
    pGVar6 = (func->value).gc;
  }
  else {
    pTVar4 = luaT_gettmbyobj(L,func,TM_CALL);
    if (pTVar4->tt != 6) {
      luaG_typeerror(L,func,"call");
    }
    pTVar12 = L->stack;
    for (pTVar5 = L->top; func < pTVar5; pTVar5 = pTVar5 + -1) {
      pTVar5->value = pTVar5[-1].value;
      pTVar5->tt = pTVar5[-1].tt;
    }
    pTVar5 = L->top;
    if ((long)L->stack_last - (long)pTVar5 < 0x11) {
      luaD_growstack(L,1);
      pTVar5 = L->top;
    }
    lVar14 = (long)func - (long)pTVar12;
    L->top = pTVar5 + 1;
    pTVar12 = L->stack;
    pGVar6 = (pTVar4->value).gc;
    *(GCObject **)((long)pTVar12 + lVar14) = pGVar6;
    *(int *)((long)pTVar12 + lVar14 + 8) = pTVar4->tt;
    func = (StkId)(lVar14 + (long)pTVar12);
  }
  pTVar12 = L->stack;
  lVar14 = (long)func - (long)pTVar12;
  pCVar7 = L->ci;
  pCVar7->savedpc = L->savedpc;
  if ((pGVar6->h).flags == '\0') {
    pgVar2 = (pGVar6->th).l_G;
    iVar13 = (uint)*(byte *)((long)&pgVar2->GCthreshold + 1) +
             (uint)*(byte *)((long)&pgVar2->GCthreshold + 3);
    if ((long)L->stack_last - (long)L->top <= (long)(ulong)(uint)(iVar13 * 0x10)) {
      luaD_growstack(L,iVar13);
      pTVar12 = L->stack;
    }
    pTVar12 = (StkId)((long)pTVar12 + lVar14);
    if (*(char *)((long)&pgVar2->GCthreshold + 2) == '\0') {
      pTVar5 = pTVar12 + 1;
      if (pTVar12 + (ulong)*(byte *)((long)&pgVar2->GCthreshold + 1) + 1 < L->top) {
        L->top = pTVar12 + (ulong)*(byte *)((long)&pgVar2->GCthreshold + 1) + 1;
      }
    }
    else {
      bVar1 = *(byte *)((long)&pgVar2->GCthreshold + 1);
      uVar8 = (ulong)bVar1;
      uVar9 = (int)((ulong)((long)L->top - (long)pTVar12) >> 4) - 1;
      pTVar5 = L->top;
      for (uVar3 = uVar9; (int)uVar3 < (int)(uint)bVar1; uVar3 = uVar3 + 1) {
        L->top = pTVar5 + 1;
        pTVar5->tt = 0;
        pTVar5 = pTVar5 + 1;
      }
      uVar3 = (uint)bVar1;
      if ((int)(uint)bVar1 < (int)uVar9) {
        uVar3 = uVar9;
      }
      piVar11 = &pTVar5[-(ulong)uVar3].tt;
      while (bVar15 = uVar8 != 0, uVar8 = uVar8 - 1, bVar15) {
        pTVar12 = L->top;
        L->top = pTVar12 + 1;
        pTVar12->value = ((TValue *)(piVar11 + -2))->value;
        pTVar12->tt = *piVar11;
        *piVar11 = 0;
        piVar11 = piVar11 + 4;
      }
      pTVar12 = (StkId)(lVar14 + (long)L->stack);
    }
    if (L->ci == L->end_ci) {
      pCVar7 = growCI(L);
    }
    else {
      pCVar7 = L->ci + 1;
      L->ci = pCVar7;
    }
    pCVar7->func = pTVar12;
    pCVar7->base = pTVar5;
    L->base = pTVar5;
    pTVar5 = pTVar5 + *(byte *)((long)&pgVar2->GCthreshold + 3);
    pCVar7->top = pTVar5;
    L->savedpc = (Instruction *)pgVar2->ud;
    pCVar7->tailcalls = 0;
    pCVar7->nresults = nresults;
    for (pTVar12 = L->top; pTVar12 < pTVar5; pTVar12 = pTVar12 + 1) {
      pTVar12->tt = 0;
    }
    L->top = pTVar5;
    iVar13 = 0;
  }
  else {
    if ((long)L->stack_last - (long)L->top < 0x141) {
      luaD_growstack(L,0x14);
      pCVar7 = L->ci;
    }
    if (pCVar7 == L->end_ci) {
      pCVar7 = growCI(L);
      pCVar10 = L->ci;
    }
    else {
      pCVar7 = pCVar7 + 1;
      L->ci = pCVar7;
      pCVar10 = pCVar7;
    }
    pTVar12 = L->stack;
    pCVar7->func = (StkId)((long)pTVar12 + lVar14);
    pTVar12 = (StkId)((long)pTVar12 + lVar14 + 0x10);
    pCVar7->base = pTVar12;
    L->base = pTVar12;
    pCVar7->top = L->top + 0x14;
    pCVar7->nresults = nresults;
    uVar3 = (*(code *)(((pCVar10->func->value).gc)->h).node)(L);
    if ((int)uVar3 < 0) {
      iVar13 = 2;
    }
    else {
      iVar13 = 1;
      luaD_poscall(L,L->top + -(ulong)uVar3);
    }
  }
  return iVar13;
}

Assistant:

static int luaD_precall(lua_State*L,StkId func,int nresults){
LClosure*cl;
ptrdiff_t funcr;
if(!ttisfunction(func))
func=tryfuncTM(L,func);
funcr=savestack(L,func);
cl=&clvalue(func)->l;
L->ci->savedpc=L->savedpc;
if(!cl->isC){
CallInfo*ci;
StkId st,base;
Proto*p=cl->p;
luaD_checkstack(L,p->maxstacksize+p->numparams);
func=restorestack(L,funcr);
if(!p->is_vararg){
base=func+1;
if(L->top>base+p->numparams)
L->top=base+p->numparams;
}
else{
int nargs=cast_int(L->top-func)-1;
base=adjust_varargs(L,p,nargs);
func=restorestack(L,funcr);
}
ci=inc_ci(L);
ci->func=func;
L->base=ci->base=base;
ci->top=L->base+p->maxstacksize;
L->savedpc=p->code;
ci->tailcalls=0;
ci->nresults=nresults;
for(st=L->top;st<ci->top;st++)
setnilvalue(st);
L->top=ci->top;
return 0;
}
else{
CallInfo*ci;
int n;
luaD_checkstack(L,20);
ci=inc_ci(L);
ci->func=restorestack(L,funcr);
L->base=ci->base=ci->func+1;
ci->top=L->top+20;
ci->nresults=nresults;
n=(*curr_func(L)->c.f)(L);
if(n<0)
return 2;
else{
luaD_poscall(L,L->top-n);
return 1;
}
}
}